

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall
FIX::Session::generateBusinessReject(Session *this,Message *message,int err,int field)

{
  SessionState *this_00;
  char *__s;
  UInt64Field *this_01;
  MsgType *pMVar1;
  uint64_t value;
  unsigned_long value_00;
  Session *this_02;
  STRING *this_03;
  STRING SStack_278;
  undefined1 local_258 [88];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Message reject;
  
  this_03 = &SStack_278;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&SStack_278,"j",(allocator<char> *)(local_258 + 0x58));
  MsgType::MsgType((MsgType *)local_258,&SStack_278);
  newMessage(&reject,this,(MsgType *)local_258);
  FieldBase::~FieldBase((FieldBase *)local_258);
  std::__cxx11::string::~string((string *)&SStack_278);
  this_01 = &FieldMap::getField<FIX::MsgSeqNum>(&(message->m_header).super_FieldMap)->
             super_SeqNumField;
  if ((this->m_sessionID).m_isFIXT == true) {
    DefaultApplVerID::DefaultApplVerID
              ((DefaultApplVerID *)local_258,&this->m_senderDefaultApplVerID);
    FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_258,true);
    FieldBase::~FieldBase((FieldBase *)local_258);
  }
  fill(this,&reject.m_header);
  pMVar1 = FieldMap::getField<FIX::MsgType>(&(message->m_header).super_FieldMap);
  RefMsgType::RefMsgType
            ((RefMsgType *)local_258,&(pMVar1->super_StringField).super_FieldBase.m_string);
  FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_258,true);
  FieldBase::~FieldBase((FieldBase *)local_258);
  value = UInt64Field::getValue(this_01);
  RefSeqNum::RefSeqNum((RefSeqNum *)local_258,value);
  FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_258,true);
  FieldBase::~FieldBase((FieldBase *)local_258);
  BusinessRejectReason::BusinessRejectReason((BusinessRejectReason *)local_258,err);
  FieldMap::setField(&reject.super_FieldMap,(FieldBase *)local_258,true);
  FieldBase::~FieldBase((FieldBase *)local_258);
  this_00 = &this->m_state;
  SessionState::incrNextTargetMsgSeqNum(this_00);
  if ((uint)err < 8) {
    __s = (&PTR_BusinessRejectReason_OTHER_TEXT_001fdbd8)[(uint)err];
    if (field == 0) {
      this_02 = (Session *)local_258;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this_02,__s,(allocator<char> *)&SStack_278);
      populateRejectReason(this_02,&reject,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x58),"Message ",&(this_01->super_FieldBase).m_string);
      std::operator+(&SStack_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x58)," Rejected: ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &SStack_278,__s);
      SessionState::onEvent(this_00,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::string::~string((string *)&SStack_278);
      this_03 = (STRING *)(local_258 + 0x58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_258,__s,(allocator<char> *)&SStack_278);
      populateRejectReason(this,&reject,field,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x98),"Message ",&(this_01->super_FieldBase).m_string);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0xb8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x98)," Rejected: ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x58),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0xb8),__s);
      std::operator+(&SStack_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x58),":");
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                ((string *)(local_258 + 0x78),(IntTConvertor<unsigned_long> *)(long)field,value_00);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                     &SStack_278,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_258 + 0x78));
      SessionState::onEvent(this_00,(string *)local_258);
      std::__cxx11::string::~string((string *)local_258);
      std::__cxx11::string::~string((string *)(local_258 + 0x78));
      std::__cxx11::string::~string((string *)&SStack_278);
      std::__cxx11::string::~string((string *)(local_258 + 0x58));
      std::__cxx11::string::~string((string *)(local_258 + 0xb8));
      this_03 = (STRING *)(local_258 + 0x98);
    }
  }
  else {
    std::operator+(&SStack_278,"Message ",&(this_01->super_FieldBase).m_string);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   &SStack_278," Rejected");
    SessionState::onEvent(this_00,(string *)local_258);
    std::__cxx11::string::~string((string *)local_258);
  }
  std::__cxx11::string::~string((string *)this_03);
  sendRaw(this,&reject,0);
  Message::~Message(&reject);
  return;
}

Assistant:

void Session::generateBusinessReject(const Message &message, int err, int field) {
  Message reject = newMessage(MsgType(MsgType_BusinessMessageReject));
  auto const &msgSeqNum = message.getHeader().getField<MsgSeqNum>();

  if (m_sessionID.isFIXT()) {
    reject.setField(DefaultApplVerID(m_senderDefaultApplVerID));
  }
  fill(reject.getHeader());
  reject.setField(RefMsgType(message.getHeader().getField<MsgType>()));
  reject.setField(RefSeqNum(msgSeqNum));
  reject.setField(BusinessRejectReason(err));
  m_state.incrNextTargetMsgSeqNum();

  const char *reason = 0;
  switch (err) {
  case BusinessRejectReason_OTHER:
    reason = BusinessRejectReason_OTHER_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_ID:
    reason = BusinessRejectReason_UNKNOWN_ID_TEXT;
    break;
  case BusinessRejectReason_UNKNOWN_SECURITY:
    reason = BusinessRejectReason_UNKNOWN_SECURITY_TEXT;
    break;
  case BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE:
    reason = BusinessRejectReason_UNSUPPORTED_MESSAGE_TYPE_TEXT;
    break;
  case BusinessRejectReason_APPLICATION_NOT_AVAILABLE:
    reason = BusinessRejectReason_APPLICATION_NOT_AVAILABLE_TEXT;
    break;
  case BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING:
    reason = BusinessRejectReason_CONDITIONALLY_REQUIRED_FIELD_MISSING_TEXT;
    break;
  case BusinessRejectReason_NOT_AUTHORIZED:
    reason = BusinessRejectReason_NOT_AUTHORIZED_TEXT;
    break;
  case BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME:
    reason = BusinessRejectReason_DELIVER_TO_FIRM_NOT_AVAILABLE_AT_THIS_TIME_TEXT;
    break;
  };

  if (reason && field) {
    populateRejectReason(reject, field, reason);
    m_state.onEvent(
        "Message " + msgSeqNum.getString() + " Rejected: " + reason + ":" + SEQNUM_CONVERTOR::convert(field));
  } else if (reason) {
    populateRejectReason(reject, reason);
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected: " + reason);
  } else {
    m_state.onEvent("Message " + msgSeqNum.getString() + " Rejected");
  }

  sendRaw(reject);
}